

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O1

int __thiscall
jrtplib::RTPUDPv6Transmitter::GetLocalHostName
          (RTPUDPv6Transmitter *this,uint8_t *buffer,size_t *bufferlength)

{
  list<in6_addr,_std::allocator<in6_addr>_> *plVar1;
  ushort uVar2;
  _List_node_base *p_Var3;
  _List_node_base *__n;
  RTPMemoryManager *pRVar4;
  void *__s2;
  bool bVar5;
  _Alloc_hider __s2_00;
  size_type sVar6;
  int iVar7;
  int iVar8;
  hostent *phVar9;
  _Node *p_Var10;
  long lVar11;
  uint8_t *puVar12;
  size_t sVar13;
  _Self __tmp;
  _List_node_base *p_Var14;
  _List_node_base *p_Var15;
  undefined1 *puVar16;
  ulong uVar17;
  bool bVar18;
  allocator<char> local_ed;
  uint local_ec;
  in6_addr ip;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  hostnames;
  string hname_1;
  string hname;
  
  if (this->init != true) {
    return -0x72;
  }
  if (this->created != true) {
    return -0x71;
  }
  if (this->localhostname == (uint8_t *)0x0) {
    plVar1 = &this->localIPs;
    p_Var14 = (this->localIPs).super__List_base<in6_addr,_std::allocator<in6_addr>_>._M_impl._M_node
              .super__List_node_base._M_next;
    if (p_Var14 == (_List_node_base *)plVar1) {
      return -0x6d;
    }
    hostnames.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&hostnames;
    hostnames.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node._M_size = 0;
    hostnames.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         hostnames.
         super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    do {
      local_ec = (uint)CONCAT71((int7)((ulong)(p_Var14 + 1) >> 8),1);
      bVar18 = false;
      do {
        ip.__in6_u._0_8_ = p_Var14[1]._M_next;
        ip.__in6_u._8_8_ = p_Var14[1]._M_prev;
        phVar9 = gethostbyaddr(&ip,0x10,10);
        if (phVar9 == (hostent *)0x0) {
          local_ec = 0;
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&hname,phVar9->h_name,(allocator<char> *)&hname_1);
          sVar6 = hname._M_string_length;
          __s2_00 = hname._M_dataplus;
          if (!bVar18) {
            p_Var15 = hostnames.
                      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl._M_node.super__List_node_base._M_next;
            bVar5 = bVar18;
            if (hostnames.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&hostnames) {
              do {
                p_Var3 = p_Var15[1]._M_prev;
                bVar18 = bVar5;
                if (p_Var3 == (_List_node_base *)sVar6) {
                  if (p_Var3 == (_List_node_base *)0x0) {
                    bVar18 = true;
                  }
                  else {
                    iVar7 = bcmp(p_Var15[1]._M_next,__s2_00._M_p,(size_t)p_Var3);
                    bVar18 = true;
                    if (iVar7 != 0) {
                      bVar18 = bVar5;
                    }
                  }
                }
                if (bVar18) goto LAB_00124369;
                p_Var15 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&p_Var15->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
                bVar5 = bVar18;
              } while (p_Var15 != (_List_node_base *)&hostnames);
            }
            if (!bVar18) {
              p_Var10 = std::__cxx11::
                        list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                        _M_create_node<std::__cxx11::string_const&>
                                  ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                    *)&hostnames,&hname);
              std::__detail::_List_node_base::_M_hook(&p_Var10->super__List_node_base);
              hostnames.
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl._M_node._M_size =
                   hostnames.
                   super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl._M_node._M_size + 1;
            }
          }
LAB_00124369:
          if (!bVar18) {
            iVar7 = 0;
            do {
              if (phVar9->h_aliases[iVar7] == (char *)0x0) break;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&hname_1,phVar9->h_aliases[iVar7],&local_ed);
              if (!bVar18) {
                if (hostnames.
                    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&hostnames)
                {
                  __s2 = (void *)CONCAT44(hname_1._M_dataplus._M_p._4_4_,
                                          hname_1._M_dataplus._M_p._0_4_);
                  p_Var3 = (_List_node_base *)
                           CONCAT44(hname_1._M_string_length._4_4_,
                                    (undefined4)hname_1._M_string_length);
                  p_Var15 = hostnames.
                            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl._M_node.super__List_node_base._M_next;
                  bVar5 = bVar18;
                  do {
                    __n = p_Var15[1]._M_prev;
                    bVar18 = bVar5;
                    if (__n == p_Var3) {
                      if (__n == (_List_node_base *)0x0) {
                        bVar18 = true;
                      }
                      else {
                        iVar8 = bcmp(p_Var15[1]._M_next,__s2,(size_t)__n);
                        bVar18 = true;
                        if (iVar8 != 0) {
                          bVar18 = bVar5;
                        }
                      }
                    }
                    if (bVar18) goto LAB_00124445;
                    p_Var15 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&p_Var15->_M_next)->_M_impl)._M_node.super__List_node_base.
                              _M_next;
                    bVar5 = bVar18;
                  } while (p_Var15 != (_List_node_base *)&hostnames);
                }
                if (!bVar18) {
                  p_Var10 = std::__cxx11::
                            list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                            _M_create_node<std::__cxx11::string_const&>
                                      ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                        *)&hostnames,&hname_1);
                  std::__detail::_List_node_base::_M_hook(&p_Var10->super__List_node_base);
                  hostnames.
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl._M_node._M_size =
                       hostnames.
                       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl._M_node._M_size + 1;
                  iVar7 = iVar7 + 1;
                }
              }
LAB_00124445:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(hname_1._M_dataplus._M_p._4_4_,hname_1._M_dataplus._M_p._0_4_) !=
                  &hname_1.field_2) {
                operator_delete((undefined1 *)
                                CONCAT44(hname_1._M_dataplus._M_p._4_4_,
                                         hname_1._M_dataplus._M_p._0_4_),
                                hname_1.field_2._M_allocated_capacity + 1);
              }
            } while (!bVar18);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)hname._M_dataplus._M_p != &hname.field_2) {
            operator_delete(hname._M_dataplus._M_p,hname.field_2._M_allocated_capacity + 1);
          }
        }
      } while ((!bVar18) && ((local_ec & 1) != 0));
      p_Var14 = p_Var14->_M_next;
    } while (p_Var14 != (_List_node_base *)plVar1);
    if (hostnames.
        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&hostnames) {
      bVar5 = false;
    }
    else {
      p_Var14 = (_List_node_base *)&hostnames;
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::sort((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)p_Var14);
      bVar18 = hostnames.
               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl._M_node.super__List_node_base._M_next == p_Var14;
      if (bVar18) {
        bVar5 = false;
      }
      else {
        bVar5 = false;
        p_Var15 = hostnames.
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl._M_node.super__List_node_base._M_next;
        do {
          lVar11 = std::__cxx11::string::find((char)(p_Var15 + 1),0x2e);
          if (lVar11 != -1) {
            p_Var3 = p_Var15[1]._M_prev;
            this->localhostnamelength = (size_t)p_Var3;
            puVar16 = (undefined1 *)((long)&p_Var3->_M_next + 1);
            pRVar4 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
            if (pRVar4 == (RTPMemoryManager *)0x0) {
              puVar12 = (uint8_t *)operator_new__((ulong)puVar16);
            }
            else {
              puVar12 = (uint8_t *)(**(code **)(*(long *)pRVar4 + 0x10))(pRVar4,puVar16,0);
            }
            this->localhostname = puVar12;
            if (puVar12 == (uint8_t *)0x0) {
              bVar5 = true;
              break;
            }
            memcpy(puVar12,p_Var15[1]._M_next,this->localhostnamelength);
            this->localhostname[this->localhostnamelength] = '\0';
            bVar5 = true;
          }
          p_Var15 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&p_Var15->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
          bVar18 = (bool)(p_Var15 == p_Var14 | bVar5);
        } while (!(bool)(p_Var15 == p_Var14 | bVar5));
      }
      if (!bVar18) goto LAB_001246aa;
    }
    if (!bVar5) {
      p_Var14 = (plVar1->super__List_base<in6_addr,_std::allocator<in6_addr>_>)._M_impl._M_node.
                super__List_node_base._M_next;
      hname_1._M_dataplus._M_p._0_4_ = *(undefined4 *)&p_Var14[1]._M_next;
      hname_1._M_dataplus._M_p._4_4_ = *(undefined4 *)((long)&p_Var14[1]._M_next + 4);
      hname_1._M_string_length._0_4_ = *(undefined4 *)&p_Var14[1]._M_prev;
      hname_1._M_string_length._4_4_ = *(undefined4 *)((long)&p_Var14[1]._M_prev + 4);
      lVar11 = 0;
      do {
        uVar2 = *(ushort *)((long)&hname_1._M_dataplus._M_p + lVar11 * 2);
        ip.__in6_u.__u6_addr16[lVar11] = uVar2 << 8 | uVar2 >> 8;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 8);
      snprintf((char *)&hname,0x30,"%04X:%04X:%04X:%04X:%04X:%04X:%04X:%04X",
               ip.__in6_u._0_8_ & 0xffff,(ulong)ip.__in6_u._0_8_ >> 0x10 & 0xffff,
               (ulong)ip.__in6_u._0_8_ >> 0x20 & 0xffff,(ulong)ip.__in6_u._0_8_ >> 0x30,
               ip.__in6_u._8_8_ & 0xffff,(ulong)ip.__in6_u._8_8_ >> 0x10 & 0xffff,
               (ulong)ip.__in6_u._8_8_ >> 0x20 & 0xffff,(ulong)ip.__in6_u._8_8_ >> 0x30);
      sVar13 = strlen((char *)&hname);
      this->localhostnamelength = (long)(int)sVar13;
      uVar17 = (long)(int)sVar13 + 1;
      pRVar4 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
      if (pRVar4 == (RTPMemoryManager *)0x0) {
        puVar12 = (uint8_t *)operator_new__(uVar17);
      }
      else {
        puVar12 = (uint8_t *)(**(code **)(*(long *)pRVar4 + 0x10))(pRVar4,uVar17,0);
      }
      this->localhostname = puVar12;
      if (puVar12 == (uint8_t *)0x0) {
LAB_001246aa:
        std::__cxx11::
        _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_clear(&hostnames.
                    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  );
        return -1;
      }
      memcpy(puVar12,&hname,this->localhostnamelength);
      this->localhostname[this->localhostnamelength] = '\0';
    }
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear(&hostnames.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              );
  }
  uVar17 = this->localhostnamelength;
  if (*bufferlength < uVar17) {
    *bufferlength = uVar17;
    iVar7 = -0x45;
  }
  else {
    memcpy(buffer,this->localhostname,uVar17);
    *bufferlength = this->localhostnamelength;
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

int RTPUDPv6Transmitter::GetLocalHostName(uint8_t *buffer,size_t *bufferlength)
{
	if (!init)
		return ERR_RTP_UDPV6TRANS_NOTINIT;

	MAINMUTEX_LOCK
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_NOTCREATED;
	}

	if (localhostname == 0)
	{
		if (localIPs.empty())
		{
			MAINMUTEX_UNLOCK
			return ERR_RTP_UDPV6TRANS_NOLOCALIPS;
		}
		
		std::list<in6_addr>::const_iterator it;
		std::list<std::string> hostnames;
	
		for (it = localIPs.begin() ; it != localIPs.end() ; it++)
		{
			bool founddouble = false;
			bool foundentry = true;

			while (!founddouble && foundentry)
			{
				struct hostent *he;
				in6_addr ip = (*it);	
			
				he = gethostbyaddr((char *)&ip,sizeof(in6_addr),AF_INET6);
				if (he != 0)
				{
					std::string hname = std::string(he->h_name);
					std::list<std::string>::const_iterator it;

					for (it = hostnames.begin() ; !founddouble && it != hostnames.end() ; it++)
						if ((*it) == hname)
							founddouble = true;

					if (!founddouble)
						hostnames.push_back(hname);

					int i = 0;
					while (!founddouble && he->h_aliases[i] != 0)
					{
						std::string hname = std::string(he->h_aliases[i]);
						
						for (it = hostnames.begin() ; !founddouble && it != hostnames.end() ; it++)
							if ((*it) == hname)
								founddouble = true;

						if (!founddouble)
						{
							hostnames.push_back(hname);
							i++;
						}
					}
				}
				else
					foundentry = false;
			}
		}
	
		bool found  = false;
		
		if (!hostnames.empty())	// try to select the most appropriate hostname
		{
			std::list<std::string>::const_iterator it;
			
			hostnames.sort();
			for (it = hostnames.begin() ; !found && it != hostnames.end() ; it++)
			{
				if ((*it).find('.') != std::string::npos)
				{
					found = true;
					localhostnamelength = (*it).length();
					localhostname = RTPNew(GetMemoryManager(),RTPMEM_TYPE_OTHER) uint8_t [localhostnamelength+1];
					if (localhostname == 0)
					{
						MAINMUTEX_UNLOCK
						return ERR_RTP_OUTOFMEM;
					}
					memcpy(localhostname,(*it).c_str(),localhostnamelength);
					localhostname[localhostnamelength] = 0;
				}
			}
		}
	
		if (!found) // use an IP address
		{
			in6_addr ip;
			int len;
			char str[48];
			uint16_t ip16[8];
			int i,j;
				
			it = localIPs.begin();
			ip = (*it);
			
			for (i = 0,j = 0 ; j < 8 ; j++,i += 2)
			{
				ip16[j] = (((uint16_t)ip.s6_addr[i])<<8);
				ip16[j] |= ((uint16_t)ip.s6_addr[i+1]);
			}			
			
			RTP_SNPRINTF(str,48,"%04X:%04X:%04X:%04X:%04X:%04X:%04X:%04X",(int)ip16[0],(int)ip16[1],(int)ip16[2],(int)ip16[3],(int)ip16[4],(int)ip16[5],(int)ip16[6],(int)ip16[7]);
			len = strlen(str);
	
			localhostnamelength = len;
			localhostname = RTPNew(GetMemoryManager(),RTPMEM_TYPE_OTHER) uint8_t [localhostnamelength+1];
			if (localhostname == 0)
			{
				MAINMUTEX_UNLOCK
				return ERR_RTP_OUTOFMEM;
			}
			memcpy(localhostname,str,localhostnamelength);
			localhostname[localhostnamelength] = 0;
		}
	}
	
	if ((*bufferlength) < localhostnamelength)
	{
		*bufferlength = localhostnamelength; // tell the application the required size of the buffer
		MAINMUTEX_UNLOCK
		return ERR_RTP_TRANS_BUFFERLENGTHTOOSMALL;
	}

	memcpy(buffer,localhostname,localhostnamelength);
	*bufferlength = localhostnamelength;
	
	MAINMUTEX_UNLOCK
	return 0;
}